

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O2

bool __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
::
_add<std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>,std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>>>>
          (Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>
           *this,set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>,_std::less<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>_>
                 *column)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *pEVar3;
  ulong uVar4;
  iterator __begin0;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
  *local_40;
  uint local_34;
  
  p_Var2 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(column->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var1) {
    if (*(long *)(this + 8) == *(long *)(this + 0x10)) {
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
      ::resize((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
                *)(this + 8),(column->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
      uVar4 = 0;
      for (p_Var2 = (column->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2))
      {
        local_40 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                    *)CONCAT44(local_40._4_4_,*(undefined4 *)&p_Var2[1].field_0x4);
        pEVar3 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
                 ::construct<unsigned_int>
                           (*(New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
                              **)(this + 0x30),(uint *)&local_40);
        *(Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
          **)(*(long *)(this + 8) + uVar4 * 8) = pEVar3;
        **(_Rb_tree_color **)(*(long *)(this + 8) + uVar4 * 8) = p_Var2[1]._M_color;
        uVar4 = (ulong)((int)uVar4 + 1);
      }
      *(int *)(this + 0x20) = (int)((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 3);
      return true;
    }
    for (; (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2))
    {
      *(int *)(this + 0x20) = *(int *)(this + 0x20) + 1;
      local_34 = *(uint *)&p_Var2[1].field_0x4;
      local_40 = New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
                 ::construct<unsigned_int>
                           (*(New_entry_constructor<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_>
                              **)(this + 0x30),&local_34);
      std::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
      ::
      emplace_back<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>
                ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
                  *)(this + 8),&local_40);
      **(_Rb_tree_color **)(*(long *)(this + 0x10) + -8) = p_Var2[1]._M_color;
      std::
      push_heap<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>**,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>>,Gudhi::persistence_matrix::Heap_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>::EntryPointerComp>
                (*(undefined8 *)(this + 8));
    }
    if ((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8) >> 3) <
        (ulong)(uint)(*(int *)(this + 0x20) * 2)) {
      Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
      ::_prune((Heap_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
                *)this);
    }
  }
  return false;
}

Assistant:

inline bool Heap_column<Master_matrix>::_add(const Entry_range& column)
{
  if (column.begin() == column.end()) return false;
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      column_[i] = entryPool_->construct(entry.get_row_index());
      if constexpr (!Master_matrix::Option_list::is_z2) {
        column_[i]->set_element(entry.get_element());
      }
      ++i;
    }
    insertsSinceLastPrune_ = column_.size();
    return true;
  }

  Field_element pivotVal(1);

  if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type)
    pivotVal = get_pivot_value();

  for (const Entry& entry : column) {
    ++insertsSinceLastPrune_;
    if constexpr (Master_matrix::Option_list::is_z2) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        if (entry.get_row_index() == Chain_opt::get_pivot()) pivotVal = !pivotVal;
      }
      column_.push_back(entryPool_->construct(entry.get_row_index()));
    } else {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        if (entry.get_row_index() == Chain_opt::get_pivot()) operators_->add_inplace(pivotVal, entry.get_element());
      }
      column_.push_back(entryPool_->construct(entry.get_row_index()));
      column_.back()->set_element(entry.get_element());
    }
    std::push_heap(column_.begin(), column_.end(), entryPointerComp_);
  }

  if (2 * insertsSinceLastPrune_ > column_.size()) _prune();

  if constexpr (Master_matrix::Option_list::is_z2)
    return !pivotVal;
  else
    return pivotVal == Field_operators::get_additive_identity();
}